

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

long openjtalk_getWideCharCode(char16_t *text)

{
  char16_t *p;
  int count;
  long res;
  char16_t *text_local;
  long local_8;
  
  if (text == (char16_t *)0x0) {
    local_8 = 0xc;
  }
  else {
    res = 0;
    count = 0;
    for (p = text; *p != 0; p = p + 1) {
      res = (ulong)*p + res * 0x10000;
      count = count + 1;
      if (count == 2) break;
    }
    local_8 = res;
  }
  return local_8;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getWideCharCode(char16_t *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char16_t *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char16_t) * 8;
		res += ((long)*p) & 0xffff;
		if (++count == 2)
		{
			break;
		}
	}
	return (long)res;
}